

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetInvalid
          (TemplatedValidityMask<unsigned_long> *this,idx_t row_idx)

{
  ulong *puVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = *(long *)this;
  if (lVar3 == 0) {
    Initialize(this,*(idx_t *)(this + 0x18));
    lVar3 = *(long *)this;
  }
  bVar2 = (byte)row_idx & 0x3f;
  puVar1 = (ulong *)(lVar3 + (row_idx >> 6) * 8);
  *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
  return;
}

Assistant:

inline void SetInvalid(idx_t row_idx) {
#ifdef DEBUG
		if (row_idx >= capacity) {
			throw InternalException("ValidityMask::SetInvalid - row_idx %d is out-of-range for mask with capacity %llu",
			                        row_idx, capacity);
		}
#endif
		if (!validity_mask) {
			Initialize(capacity);
		}
		SetInvalidUnsafe(row_idx);
	}